

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_set_last_insert_rowid(sqlite3 *db,sqlite3_int64 iRowid)

{
  undefined8 in_RSI;
  long in_RDI;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x13e63c);
  *(undefined8 *)(in_RDI + 0x38) = in_RSI;
  sqlite3_mutex_leave((sqlite3_mutex *)0x13e658);
  return;
}

Assistant:

SQLITE_API void sqlite3_set_last_insert_rowid(sqlite3 *db, sqlite3_int64 iRowid){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  db->lastRowid = iRowid;
  sqlite3_mutex_leave(db->mutex);
}